

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseJacocoCoverage.cxx
# Opt level: O2

void __thiscall
cmParseJacocoCoverage::XMLParser::StartElement(XMLParser *this,string *name,char **atts)

{
  string *psVar1;
  cmCTest *pcVar2;
  pointer pbVar3;
  char *pcVar4;
  pointer piVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  ostream *poVar9;
  mapped_type *pmVar10;
  long lVar11;
  ulong uVar12;
  char **ppcVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  string line;
  string FilePath;
  byte abStack_218 [488];
  
  bVar6 = std::operator==(name,"package");
  if (bVar6) {
    psVar1 = &this->PackageName;
    std::__cxx11::string::assign((char *)psVar1);
    std::operator+(&local_3d0,&this->Coverage->SourceDir,"/");
    std::operator+(&local_3f8,&local_3d0,&this->ModuleName);
    std::operator+(&line,&local_3f8,"/src/main/java/");
    std::operator+(&FilePath,&line,psVar1);
    std::__cxx11::string::~string((string *)&line);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->FilePaths,&FilePath);
    std::operator+(&local_3f8,&this->Coverage->SourceDir,"/src/main/java/");
    std::operator+(&line,&local_3f8,psVar1);
    std::__cxx11::string::operator=((string *)&FilePath,(string *)&line);
    std::__cxx11::string::~string((string *)&line);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->FilePaths,&FilePath);
    std::__cxx11::string::~string((string *)&FilePath);
  }
  else {
    bVar6 = std::operator==(name,"sourcefile");
    if (bVar6) {
      local_3d8 = &this->FileName;
      std::__cxx11::string::assign((char *)local_3d8);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&FilePath);
      poVar9 = std::operator<<((ostream *)&FilePath,"Reading file: ");
      poVar9 = std::operator<<(poVar9,(string *)local_3d8);
      std::endl<char,std::char_traits<char>>(poVar9);
      pcVar2 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmParseJacocoCoverage.cxx"
                   ,0x36,line._M_dataplus._M_p,this->Coverage->Quiet);
      std::__cxx11::string::~string((string *)&line);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&FilePath);
      lVar11 = 0;
      for (uVar12 = 0;
          pbVar3 = (this->FilePaths).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          uVar12 < (ulong)((long)(this->FilePaths).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5);
          uVar12 = uVar12 + 1) {
        std::operator+(&line,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&(pbVar3->_M_dataplus)._M_p + lVar11),"/");
        std::operator+(&FilePath,&line,local_3d8);
        std::__cxx11::string::~string((string *)&line);
        bVar6 = cmsys::SystemTools::FileExists(FilePath._M_dataplus._M_p);
        if (bVar6) {
          std::__cxx11::string::_M_assign((string *)&this->CurFileName);
          std::__cxx11::string::~string((string *)&FilePath);
          break;
        }
        std::__cxx11::string::~string((string *)&FilePath);
        lVar11 = lVar11 + 0x20;
      }
      psVar1 = &this->CurFileName;
      std::ifstream::ifstream(&FilePath,(this->CurFileName)._M_dataplus._M_p,_S_in);
      bVar6 = std::operator==(psVar1,"");
      if ((bVar6) || ((abStack_218[*(long *)(FilePath._M_dataplus._M_p + -0x18)] & 5) != 0)) {
        std::operator+(&local_3f8,&this->Coverage->BinaryDir,"/");
        std::operator+(&line,&local_3f8,local_3d8);
        std::__cxx11::string::operator=((string *)psVar1,(string *)&line);
        std::__cxx11::string::~string((string *)&line);
        std::__cxx11::string::~string((string *)&local_3f8);
        std::ifstream::open((char *)&FilePath,(_Ios_Openmode)(psVar1->_M_dataplus)._M_p);
        if ((abStack_218[*(long *)(FilePath._M_dataplus._M_p + -0x18)] & 5) != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&line);
          poVar9 = std::operator<<((ostream *)&line,"Jacoco Coverage: Error opening ");
          poVar9 = std::operator<<(poVar9,(string *)psVar1);
          std::endl<char,std::char_traits<char>>(poVar9);
          pcVar2 = this->CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmParseJacocoCoverage.cxx"
                       ,0x4a,(char *)CONCAT44(local_3f8._M_dataplus._M_p._4_4_,
                                              local_3f8._M_dataplus._M_p._0_4_),false);
          std::__cxx11::string::~string((string *)&local_3f8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&line);
          this->Coverage->Error = this->Coverage->Error + 1;
        }
      }
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::operator[](&this->Coverage->TotalCoverage,psVar1);
      if ((abStack_218[*(long *)(FilePath._M_dataplus._M_p + -0x18)] & 5) == 0) {
        local_3f8._M_dataplus._M_p._0_4_ = 0xffffffff;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(pmVar10,(int *)&local_3f8);
      }
      while( true ) {
        bVar6 = cmsys::SystemTools::GetLineFromStream((istream *)&FilePath,&line,(bool *)0x0,-1);
        if (!bVar6) break;
        local_3f8._M_dataplus._M_p._0_4_ = 0xffffffff;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(pmVar10,(int *)&local_3f8);
      }
      std::__cxx11::string::~string((string *)&line);
      std::ifstream::~ifstream(&FilePath);
    }
    else {
      bVar6 = std::operator==(name,"report");
      if (bVar6) {
        std::__cxx11::string::assign((char *)&this->ModuleName);
        return;
      }
      bVar6 = std::operator==(name,"line");
      if (bVar6) {
        ppcVar13 = atts + 1;
        uVar8 = 0xffffffff;
        iVar7 = -1;
        do {
          pcVar4 = ppcVar13[-1];
          if (*pcVar4 == 'n') {
            if ((pcVar4[1] == 'r') && (pcVar4[2] == '\0')) {
              uVar8 = atoi(*ppcVar13);
            }
          }
          else if (((*pcVar4 == 'c') && (pcVar4[1] == 'i')) && (pcVar4[2] == '\0')) {
            iVar7 = atoi(*ppcVar13);
          }
          ppcVar13 = ppcVar13 + 1;
        } while ((int)uVar8 < 1 || iVar7 < 0);
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::operator[](&this->Coverage->TotalCoverage,&this->CurFileName);
        piVar5 = (pmVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (piVar5 != (pmVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish) {
          piVar5[(ulong)uVar8 - 1] = iVar7;
        }
      }
    }
  }
  return;
}

Assistant:

virtual void StartElement(const std::string& name,
      const char** atts)
      {
      if(name == "package")
        {
        this->PackageName = atts[1];
        std::string FilePath = this->Coverage.SourceDir +
          "/" + this->ModuleName + "/src/main/java/" +
          this->PackageName;
        this->FilePaths.push_back(FilePath);
        FilePath = this->Coverage.SourceDir +
         "/src/main/java/" + this->PackageName;
        this->FilePaths.push_back(FilePath);
        }
      else if(name == "sourcefile")
        {
        this->FileName = atts[1];
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
          "Reading file: " << this->FileName << std::endl,
          this->Coverage.Quiet);
          for(size_t i=0;i < FilePaths.size();i++)
            {
            std::string finalpath = FilePaths[i] + "/" + this->FileName;
            if(cmSystemTools::FileExists(finalpath.c_str()))
              {
              this->CurFileName = finalpath;
              break;
              }
            }
          cmsys::ifstream fin(this->CurFileName.c_str());
          if(this->CurFileName == "" || !fin )
          {
            this->CurFileName = this->Coverage.BinaryDir + "/" +
                                   this->FileName;
            fin.open(this->CurFileName.c_str());
            if (!fin)
            {
              cmCTestLog(this->CTest, ERROR_MESSAGE,
                         "Jacoco Coverage: Error opening " << this->CurFileName
                         << std::endl);
              this->Coverage.Error++;
            }
          }
          std::string line;
          FileLinesType& curFileLines =
            this->Coverage.TotalCoverage[this->CurFileName];
          if(fin)
            {
            curFileLines.push_back(-1);
            }
          while(cmSystemTools::GetLineFromStream(fin, line))
          {
            curFileLines.push_back(-1);
          }
        }
      else if(name == "report")
        {
        this->ModuleName=atts[1];
        }
      else if(name == "line")
        {
        int tagCount = 0;
        int nr = -1;
        int ci = -1;
        while(true)
          {
          if(strcmp(atts[tagCount],"ci") == 0)
            {
            ci = atoi(atts[tagCount+1]);
            }
          else if (strcmp(atts[tagCount],"nr") == 0)
            {
            nr = atoi(atts[tagCount+1]);
            }
          if (ci > -1 && nr > 0)
            {
            FileLinesType& curFileLines=
              this->Coverage.TotalCoverage[this->CurFileName];
            if(!curFileLines.empty())
               {
               curFileLines[nr-1] = ci;
               }
            break;
            }
          ++tagCount;
          }
        }
      }